

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatmain.c
# Opt level: O0

void ecx_readeeprom1(ecx_contextt *context,uint16 slave,uint16 eeproma)

{
  int iVar1;
  uint16 uVar2;
  int iVar3;
  bool local_29;
  int local_28;
  int cnt;
  int wkc;
  uint16 local_18;
  ec_eepromt ed;
  uint16 estat;
  uint16 configadr;
  uint16 eeproma_local;
  uint16 slave_local;
  ecx_contextt *context_local;
  
  local_28 = 0;
  ed.addr = eeproma;
  ed.d2 = slave;
  ecx_eeprom2master(context,slave);
  ed.comm = context->slavelist[ed.d2].configadr;
  uVar2 = ecx_eeprom_waitnotbusyFP(context,ed.comm,&local_18,20000);
  if (uVar2 != 0) {
    if ((local_18 & 0x7800) != 0) {
      local_18 = 0;
      ecx_FPWR(context->port,ed.comm,0x502,2,&local_18,6000);
    }
    cnt._2_2_ = 0x100;
    wkc._0_2_ = ed.addr;
    wkc._2_2_ = 0;
    do {
      iVar1 = local_28;
      iVar3 = ecx_FPWR(context->port,ed.comm,0x502,6,(void *)((long)&cnt + 2),2000);
      if (iVar3 < 1) {
        local_28 = local_28 + 1;
      }
      local_29 = iVar3 < 1 && iVar1 < 3;
    } while (local_29);
  }
  return;
}

Assistant:

void ecx_readeeprom1(ecx_contextt *context, uint16 slave, uint16 eeproma)
{
   uint16 configadr, estat;
   ec_eepromt ed;
   int wkc, cnt = 0;

   ecx_eeprom2master(context, slave); /* set eeprom control to master */
   configadr = context->slavelist[slave].configadr;
   if (ecx_eeprom_waitnotbusyFP(context, configadr, &estat, EC_TIMEOUTEEP))
   {
      if (estat & EC_ESTAT_EMASK) /* error bits are set */
      {
         estat = htoes(EC_ECMD_NOP); /* clear error bits */
         wkc = ecx_FPWR(context->port, configadr, ECT_REG_EEPCTL, sizeof(estat), &estat, EC_TIMEOUTRET3);
      }
      ed.comm = htoes(EC_ECMD_READ);
      ed.addr = htoes(eeproma);
      ed.d2   = 0x0000;
      do
      {
         wkc = ecx_FPWR(context->port, configadr, ECT_REG_EEPCTL, sizeof(ed), &ed, EC_TIMEOUTRET);
      }
      while ((wkc <= 0) && (cnt++ < EC_DEFAULTRETRIES));
   }
}